

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

void rtr_mgr_stop(rtr_mgr_config *config)

{
  long lVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  uint local_2c;
  uint j;
  rtr_mgr_group_node *group_node;
  tommy_node *node;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  group_node = (rtr_mgr_group_node *)tommy_list_head(&config->groups->list);
  lrtr_dbg("RTR_MGR: %s()","rtr_mgr_stop");
  for (; group_node != (rtr_mgr_group_node *)0x0;
      group_node = (rtr_mgr_group_node *)(group_node->node).next) {
    pvVar2 = (group_node->node).data;
    for (local_2c = 0; local_2c < *(uint *)(*(long *)((long)pvVar2 + 0x20) + 8);
        local_2c = local_2c + 1) {
      rtr_stop(*(rtr_socket **)(**(long **)((long)pvVar2 + 0x20) + (ulong)local_2c * 8));
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT void rtr_mgr_stop(struct rtr_mgr_config *config)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	MGR_DBG("%s()", __func__);
	while (node) {
		struct rtr_mgr_group_node *group_node = node->data;

		for (unsigned int j = 0; j < group_node->group->sockets_len; j++)
			rtr_stop(group_node->group->sockets[j]);
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
}